

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iostl.c
# Opt level: O2

void trico_remove_duplicate_vertices
               (uint32_t *nr_of_vertices,float **vertices,uint32_t nr_of_triangles,
               uint32_t **triangles)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t *puVar3;
  float *pfVar4;
  float fVar5;
  float *pfVar6;
  float *L;
  float *pfVar7;
  float *pfVar8;
  ulong uVar9;
  float *pfVar10;
  uint32_t uVar11;
  
  if (nr_of_triangles == 0) {
    return;
  }
  L = (float *)malloc((ulong)(nr_of_triangles * 3) << 4);
  puVar3 = *triangles;
  pfVar4 = *vertices;
  pfVar8 = L;
  for (uVar9 = 0; (ulong)nr_of_triangles * 3 != uVar9; uVar9 = uVar9 + 3) {
    fVar5 = (float)uVar9;
    uVar11 = puVar3[uVar9 & 0xffffffff];
    uVar1 = puVar3[(uint)((int)fVar5 + 1)];
    uVar2 = puVar3[(uint)((int)fVar5 + 2)];
    *pfVar8 = pfVar4[uVar11 * 3];
    pfVar8[1] = pfVar4[uVar11 * 3 + 1];
    pfVar8[2] = pfVar4[uVar11 * 3 + 2];
    pfVar8[3] = fVar5;
    pfVar8[4] = pfVar4[uVar1 * 3];
    pfVar8[5] = pfVar4[uVar1 * 3 + 1];
    pfVar8[6] = pfVar4[uVar1 * 3 + 2];
    pfVar8[7] = (float)((int)fVar5 + 1);
    pfVar8[8] = pfVar4[uVar2 * 3];
    pfVar8[9] = pfVar4[uVar2 * 3 + 1];
    pfVar8[10] = pfVar4[uVar2 * 3 + 2];
    pfVar8[0xb] = (float)((int)fVar5 + 2);
    pfVar8 = pfVar8 + 0xc;
  }
  uVar11 = 0;
  trico_quicksort_vertices(L,0,(ulong)(nr_of_triangles * 3 - 1));
  *nr_of_vertices = 0;
  *pfVar4 = *L;
  pfVar4[1] = L[1];
  pfVar4[2] = L[2];
  pfVar8 = L;
  pfVar10 = L;
  do {
    puVar3[(uint)pfVar10[3]] = uVar11;
    while( true ) {
      pfVar6 = pfVar10;
      pfVar10 = pfVar6 + 4;
      if (pfVar10 == L + nr_of_triangles * 0xc) {
        for (; pfVar6 != pfVar8; pfVar8 = pfVar8 + 4) {
          puVar3[(uint)pfVar8[7]] = *nr_of_vertices;
        }
        *nr_of_vertices = *nr_of_vertices + 1;
        free(L);
        return;
      }
      pfVar7 = pfVar8;
      if ((((*pfVar8 != *pfVar10) || (NAN(*pfVar8) || NAN(*pfVar10))) || (pfVar8[1] != pfVar6[5]))
         || (NAN(pfVar8[1]) || NAN(pfVar6[5]))) break;
      if ((pfVar8[2] != pfVar6[6]) || (NAN(pfVar8[2]) || NAN(pfVar6[6]))) break;
    }
    while( true ) {
      pfVar8 = pfVar7 + 4;
      if (pfVar7 == pfVar6) break;
      puVar3[(uint)pfVar7[7]] = *nr_of_vertices;
      pfVar7 = pfVar8;
    }
    uVar11 = *nr_of_vertices + 1;
    *nr_of_vertices = uVar11;
    pfVar4[uVar11 * 3] = *pfVar8;
    pfVar4[uVar11 * 3 + 1] = pfVar6[5];
    pfVar4[uVar11 * 3 + 2] = pfVar6[6];
  } while( true );
}

Assistant:

static void trico_remove_duplicate_vertices(uint32_t* nr_of_vertices, float** vertices, uint32_t nr_of_triangles, uint32_t** triangles)
  {
  if (nr_of_triangles == 0)
    return;

  float* vert = (float*)trico_malloc(nr_of_triangles * 3 * sizeof(float) * 4);

  float* p_vert = vert;
  for (uint32_t i = 0; i < nr_of_triangles; ++i)
    {
    const uint32_t id0 = i * 3;
    const uint32_t id1 = id0 + 1;
    const uint32_t id2 = id1 + 1;
    const uint32_t v0 = (*triangles)[id0];
    const uint32_t v1 = (*triangles)[id1];
    const uint32_t v2 = (*triangles)[id2];


    *p_vert++ = (*vertices)[v0 * 3];
    *p_vert++ = (*vertices)[v0 * 3 + 1];
    *p_vert++ = (*vertices)[v0 * 3 + 2];
    *p_vert++ = *(const float*)(&id0);

    *p_vert++ = (*vertices)[v1 * 3];
    *p_vert++ = (*vertices)[v1 * 3 + 1];
    *p_vert++ = (*vertices)[v1 * 3 + 2];
    *p_vert++ = *(const float*)(&id1);

    *p_vert++ = (*vertices)[v2 * 3];
    *p_vert++ = (*vertices)[v2 * 3 + 1];
    *p_vert++ = (*vertices)[v2 * 3 + 2];
    *p_vert++ = *(const float*)(&id2);
    }

  trico_quicksort_vertices(vert, 0, (3 * nr_of_triangles) - 1);

  float* first = vert;
  float* last = vert + 3 * nr_of_triangles * 4;

  *nr_of_vertices = 0;

  float* result = first;
  (*vertices)[*nr_of_vertices * 3] = result[0];
  (*vertices)[*nr_of_vertices * 3 + 1] = result[1];
  (*vertices)[*nr_of_vertices * 3 + 2] = result[2];
  (*triangles)[*(uint32_t*)(&(result[3]))] = *nr_of_vertices;
  while ((first += 4) != last)
    {
    if (trico_equal_vertices(result, first) == 0)
      {
      while ((result += 4) != first)
        {
        (*triangles)[*(uint32_t*)(&(result[3]))] = *nr_of_vertices;
        }
      ++(*nr_of_vertices);
      (*vertices)[*nr_of_vertices * 3] = result[0];
      (*vertices)[*nr_of_vertices * 3 + 1] = result[1];
      (*vertices)[*nr_of_vertices * 3 + 2] = result[2];
      (*triangles)[*(uint32_t*)(&(result[3]))] = *nr_of_vertices;
      }
    }
  while ((result += 4) != first)
    {
    (*triangles)[*(uint32_t*)(&(result[3]))] = *nr_of_vertices;
    }
  ++(*nr_of_vertices);

  trico_free(vert);
  }